

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadAiger.c
# Opt level: O2

Abc_Ntk_t * Io_ReadAiger(char *pFileName,int fCheck)

{
  long *plVar1;
  int *piVar2;
  Abc_Ntk_t *pNtk;
  Vec_Int_t *__ptr;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  gzFile file;
  FILE *pFVar9;
  FILE *pFVar10;
  BZFILE *b;
  void *buf;
  undefined4 extraout_var;
  Abc_Ntk_t *pAVar11;
  char *pcVar12;
  Vec_Ptr_t *pVVar13;
  void **ppvVar14;
  Abc_Obj_t *pAVar15;
  Abc_Obj_t *pAVar16;
  Abc_Obj_t *pObj;
  void *pvVar17;
  void *pvVar18;
  Vec_Ptr_t **ppVVar19;
  char cVar20;
  uint uVar21;
  char *pcVar22;
  long lVar23;
  FILE *pFVar24;
  byte bVar25;
  ulong uVar26;
  bool bVar27;
  size_t sStack_c0;
  FILE *local_b0;
  Abc_Ntk_t *local_a8;
  int local_9c;
  FILE *local_98;
  FILE *local_90;
  Vec_Ptr_t **local_88;
  int local_7c;
  FILE *local_78;
  Vec_Ptr_t *local_70;
  Vec_Ptr_t **local_68;
  undefined4 local_5c;
  ProgressBar *local_58;
  uint local_4c;
  Vec_Int_t *local_48;
  ulong local_40;
  ulong local_38;
  
  sVar8 = strlen(pFileName);
  iVar4 = strncmp(pFileName + (sVar8 - 4),".bz2",4);
  if (iVar4 == 0) {
    pFVar10 = fopen(pFileName,"rb");
    local_68 = (Vec_Ptr_t **)CONCAT44(local_68._4_4_,0xffffffff);
    if (pFVar10 == (FILE *)0x0) {
      pcVar22 = "Ioa_ReadLoadFileBz2(): The file is unavailable (absent or open).";
LAB_006ccf8a:
      puts(pcVar22);
      pFVar9 = (FILE *)0x0;
    }
    else {
      iVar4 = 0;
      b = BZ2_bzReadOpen(&local_7c,(FILE *)pFVar10,0,0,(void *)0x0,0);
      if (local_7c == 0) {
        pvVar18 = (void *)0x0;
        pvVar17 = (void *)0x0;
        local_a8 = (Abc_Ntk_t *)pFileName;
        local_9c = fCheck;
        local_90 = pFVar10;
        do {
          buf = malloc(0x100010);
          pvVar3 = buf;
          if (pvVar18 != (void *)0x0) {
            *(void **)((long)pvVar17 + 0x100008) = buf;
            pvVar3 = pvVar18;
          }
          pvVar18 = pvVar3;
          iVar6 = BZ2_bzRead(&local_7c,b,buf,0x100000);
          fCheck = local_9c;
          *(int *)((long)buf + 0x100000) = iVar6;
          iVar4 = iVar4 + iVar6;
          *(undefined8 *)((long)buf + 0x100008) = 0;
          pvVar17 = buf;
        } while (local_7c == 0);
        if (local_7c == -5) {
          BZ2_bzReadClose(&local_7c,b);
          pFVar10 = local_90;
          fseek(local_90,0,2);
          lVar23 = ftell(pFVar10);
          fCheck = local_9c;
          pFileName = (char *)local_a8;
          iVar4 = (int)lVar23;
          if (iVar4 == 0) {
            pcVar22 = "Ioa_ReadLoadFileBz2(): The file is empty.";
            goto LAB_006ccf8a;
          }
          pFVar9 = (FILE *)malloc((long)(iVar4 + 10));
          rewind(pFVar10);
          fread(pFVar9,(long)iVar4,1,pFVar10);
        }
        else {
          if (local_7c != 4) {
            puts("Ioa_ReadLoadFileBz2(): Unable to read the compressed BLIF.");
            pFVar9 = (FILE *)0x0;
            pFileName = (char *)local_a8;
            goto LAB_006cd11d;
          }
          BZ2_bzReadClose(&local_7c,b);
          pFVar9 = (FILE *)malloc((long)(iVar4 + 10));
          iVar6 = 0;
          do {
            memcpy((char *)((long)&pFVar9->_flags + (long)iVar6),pvVar18,
                   (long)*(int *)((long)pvVar18 + 0x100000));
            iVar6 = iVar6 + *(int *)((long)pvVar18 + 0x100000);
            pvVar17 = *(void **)((long)pvVar18 + 0x100008);
            free(pvVar18);
            pFVar10 = local_90;
            pFileName = (char *)local_a8;
            pvVar18 = pvVar17;
          } while (pvVar17 != (void *)0x0);
        }
        fclose(pFVar10);
        local_68 = (Vec_Ptr_t **)CONCAT44(local_68._4_4_,iVar4);
      }
      else {
        pFVar9 = (FILE *)0x0;
        printf("Ioa_ReadLoadFileBz2(): BZ2_bzReadOpen() failed with error %d.\n");
      }
    }
  }
  else if (((pFileName[sVar8 - 3] == '.') && (pFileName[sVar8 - 2] == 'g')) &&
          (pFileName[sVar8 - 1] == 'z')) {
    file = gzopen(pFileName,"rb");
    pFVar9 = (FILE *)malloc(100000);
    lVar23 = 0;
    while( true ) {
      iVar4 = gzread(file,(char *)((long)&pFVar9->_flags + lVar23),100000);
      if (iVar4 != 100000) break;
      if (pFVar9 == (FILE *)0x0) {
        pFVar9 = (FILE *)malloc(lVar23 + 200000U);
      }
      else {
        pFVar9 = (FILE *)realloc(pFVar9,lVar23 + 200000U);
      }
      lVar23 = lVar23 + 100000;
    }
    if (iVar4 == -1) {
      __assert_fail("amtRead != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadAiger.c"
                    ,0xd7,"char *Ioa_ReadLoadFileGzAig(char *, int *)");
    }
    local_68 = (Vec_Ptr_t **)CONCAT44(local_68._4_4_,iVar4 + (int)lVar23);
    gzclose(file);
  }
  else {
    iVar4 = Extra_FileSize(pFileName);
    pFVar10 = fopen(pFileName,"rb");
    local_68 = (Vec_Ptr_t **)CONCAT44(local_68._4_4_,iVar4);
    pFVar9 = (FILE *)malloc((long)iVar4);
    fread(pFVar9,(long)iVar4,1,pFVar10);
    fclose(pFVar10);
  }
LAB_006cd11d:
  if ((((char)pFVar9->_flags == 'a') && (*(char *)((long)&pFVar9->_flags + 1) == 'i')) &&
     ((*(char *)((long)&pFVar9->_flags + 2) == 'g' &&
      ((cVar20 = *(char *)((long)&pFVar9->_flags + 3), pFVar10 = pFVar9, cVar20 == '2' ||
       (cVar20 == ' ')))))) {
    do {
      piVar2 = &pFVar10->_flags;
      pFVar10 = (FILE *)((long)&pFVar10->_flags + 1);
    } while ((char)*piVar2 != ' ');
    local_b0 = pFVar10;
    local_90 = pFVar9;
    iVar4 = atoi((char *)pFVar10);
    local_a8 = (Abc_Ntk_t *)CONCAT44(local_a8._4_4_,iVar4);
    do {
      piVar2 = &pFVar10->_flags;
      pFVar10 = (FILE *)((long)&pFVar10->_flags + 1);
    } while ((char)*piVar2 != ' ');
    local_b0 = pFVar10;
    uVar5 = atoi((char *)pFVar10);
    ppVVar19 = (Vec_Ptr_t **)(ulong)uVar5;
    do {
      piVar2 = &pFVar10->_flags;
      pFVar10 = (FILE *)((long)&pFVar10->_flags + 1);
    } while ((char)*piVar2 != ' ');
    local_b0 = pFVar10;
    uVar5 = atoi((char *)pFVar10);
    pFVar9 = (FILE *)(ulong)uVar5;
    do {
      piVar2 = &pFVar10->_flags;
      pFVar10 = (FILE *)((long)&pFVar10->_flags + 1);
    } while ((char)*piVar2 != ' ');
    local_b0 = pFVar10;
    iVar4 = atoi((char *)pFVar10);
    do {
      piVar2 = &pFVar10->_flags;
      pFVar10 = (FILE *)((long)&pFVar10->_flags + 1);
    } while ((char)*piVar2 != ' ');
    local_b0 = pFVar10;
    iVar6 = atoi((char *)pFVar10);
    local_78 = (FILE *)CONCAT44(extraout_var,iVar6);
    do {
      cVar20 = (char)pFVar10->_flags;
      if (cVar20 == '\n') {
        local_5c = 0;
        goto LAB_006cd274;
      }
      pFVar10 = (FILE *)((long)&pFVar10->_flags + 1);
    } while (cVar20 != ' ');
    local_b0 = pFVar10;
    iVar6 = atoi((char *)pFVar10);
    for (; (cVar20 = (char)pFVar10->_flags, cVar20 != '\n' && (cVar20 != ' '));
        pFVar10 = (FILE *)((long)&pFVar10->_flags + 1)) {
    }
    iVar4 = iVar4 + iVar6;
    local_5c = CONCAT31((int3)((uint)iVar6 >> 8),iVar6 != 0);
LAB_006cd274:
    cVar20 = (char)pFVar10->_flags;
    bVar27 = false;
    if (cVar20 == ' ') {
      pFVar10 = (FILE *)((long)&pFVar10->_flags + 1);
      local_b0 = pFVar10;
      uVar5 = atoi((char *)pFVar10);
      for (; (cVar20 = (char)pFVar10->_flags, cVar20 != '\n' && (cVar20 != ' '));
          pFVar10 = (FILE *)((long)&pFVar10->_flags + 1)) {
      }
      iVar4 = uVar5 + iVar4;
      cVar20 = (char)pFVar10->_flags;
      if (cVar20 == ' ') {
        pFVar10 = (FILE *)((long)&pFVar10->_flags + 1);
        local_b0 = pFVar10;
        local_98 = pFVar9;
        local_88 = ppVVar19;
        iVar6 = atoi((char *)pFVar10);
        for (; (cVar20 = (char)pFVar10->_flags, cVar20 != '\n' && (cVar20 != ' '));
            pFVar10 = (FILE *)((long)&pFVar10->_flags + 1)) {
        }
        iVar4 = iVar4 + iVar6;
        bVar27 = iVar6 != 0;
        cVar20 = (char)pFVar10->_flags;
        ppVVar19 = local_88;
        pFVar9 = local_98;
        local_b0 = pFVar10;
        if (cVar20 == ' ') {
          pFVar10 = (FILE *)((long)&pFVar10->_flags + 1);
          local_b0 = pFVar10;
          iVar7 = atoi((char *)pFVar10);
          for (; (cVar20 = (char)pFVar10->_flags, cVar20 != '\n' && (cVar20 != ' '));
              pFVar10 = (FILE *)((long)&pFVar10->_flags + 1)) {
          }
          iVar4 = iVar4 + iVar7;
          cVar20 = (char)pFVar10->_flags;
          bVar27 = iVar6 != 0 || iVar7 != 0;
          ppVVar19 = local_88;
          pFVar9 = local_98;
          local_b0 = pFVar10;
        }
      }
      else {
        bVar27 = false;
        local_b0 = pFVar10;
      }
    }
    else {
      uVar5 = 0;
      local_b0 = pFVar10;
    }
    pFVar10 = local_90;
    if (cVar20 == '\n') {
      pFVar24 = (FILE *)((long)&local_b0->_flags + 1);
      uVar21 = (int)pFVar9 + (int)ppVVar19;
      local_40 = (ulong)uVar21;
      local_b0 = pFVar24;
      if ((int)local_a8 == (int)local_78 + uVar21) {
        local_88 = ppVVar19;
        if (!bVar27) {
          local_98 = pFVar9;
          if (uVar5 != 0) {
            if (uVar5 == 1) {
              fwrite("Warning: The last output is interpreted as a constraint.\n",0x39,1,_stdout);
            }
            else {
              fprintf(_stdout,"Warning: The last %d outputs are interpreted as constraints.\n",
                      (ulong)uVar5);
            }
          }
          local_58 = (ProgressBar *)CONCAT44(local_58._4_4_,iVar4);
          local_4c = uVar5;
          pAVar11 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
          pcVar22 = Extra_FileNameGeneric(pFileName);
          pcVar12 = Extra_UtilStrsav(pcVar22);
          pAVar11->pName = pcVar12;
          pcVar12 = Extra_UtilStrsav(pFileName);
          pAVar11->pSpec = pcVar12;
          free(pcVar22);
          pAVar11->nConstrs = local_4c;
          iVar6 = (int)local_78 + 1 + (int)local_40;
          local_a8 = pAVar11;
          pVVar13 = (Vec_Ptr_t *)malloc(0x10);
          iVar4 = 8;
          if (6 < iVar6 - 1U) {
            iVar4 = iVar6;
          }
          pVVar13->nSize = 0;
          pVVar13->nCap = iVar4;
          uVar26 = 0;
          if (iVar4 == 0) {
            ppvVar14 = (void **)0x0;
          }
          else {
            ppvVar14 = (void **)malloc((long)iVar4 << 3);
          }
          ppVVar19 = local_88;
          iVar4 = (int)local_88;
          local_38 = (ulong)((int)local_98 + iVar4 + 1);
          pVVar13->pArray = ppvVar14;
          pAVar15 = Abc_AigConst1(local_a8);
          Vec_PtrPush(pVVar13,(void *)((ulong)pAVar15 ^ 1));
          if (0 < iVar4) {
            uVar26 = (ulong)ppVVar19 & 0xffffffff;
          }
          while (pAVar11 = local_a8, iVar4 = (int)uVar26, uVar26 = (ulong)(iVar4 - 1), iVar4 != 0) {
            pAVar15 = Abc_NtkCreateObj(local_a8,ABC_OBJ_PI);
            Vec_PtrPush(pVVar13,pAVar15);
          }
          iVar4 = 0;
          local_9c = fCheck;
          if (0 < (int)local_58) {
            iVar4 = (int)local_58;
          }
          while (iVar4 != 0) {
            Abc_NtkCreateObj(pAVar11,ABC_OBJ_PO);
            iVar4 = iVar4 + -1;
          }
          uVar26 = 0;
          local_70 = pVVar13;
          if (0 < (int)local_98) {
            uVar26 = (ulong)local_98 & 0xffffffff;
          }
          while (pAVar11 = local_a8, iVar4 = (int)uVar26, uVar26 = (ulong)(iVar4 - 1), iVar4 != 0) {
            pAVar15 = Abc_NtkCreateObj(local_a8,ABC_OBJ_LATCH);
            Abc_LatchSetInit0(pAVar15);
            pAVar16 = Abc_NtkCreateObj(pAVar11,ABC_OBJ_BI);
            pObj = Abc_NtkCreateObj(pAVar11,ABC_OBJ_BO);
            Abc_ObjAddFanin(pAVar15,pAVar16);
            pFVar10 = local_90;
            Abc_ObjAddFanin(pObj,pAVar15);
            Vec_PtrPush(local_70,pObj);
          }
          if (*(char *)((long)&pFVar10->_flags + 3) == ' ') {
            local_b0 = pFVar24;
            for (iVar4 = 0; iVar4 < (int)local_58 + (int)local_98;
                iVar4 = iVar4 + (uint)((char)*piVar2 == '\n')) {
              piVar2 = &local_b0->_flags;
              local_b0 = (FILE *)((long)&local_b0->_flags + 1);
            }
            local_48 = (Vec_Int_t *)0x0;
          }
          else {
            local_48 = Io_WriteDecodeLiterals((char **)&local_b0,(int)local_58 + (int)local_98);
            pFVar24 = (FILE *)0x0;
          }
          pVVar13 = local_70;
          pFVar9 = local_78;
          pAVar11 = local_a8;
          iVar4 = (int)local_78;
          local_58 = Extra_ProgressBarStart((FILE *)_stdout,iVar4);
          ppVVar19 = (Vec_Ptr_t **)0x0;
          local_78 = (FILE *)((ulong)pFVar9 & 0xffffffff);
          if (iVar4 < 1) {
            local_78 = (FILE *)ppVVar19;
          }
          iVar4 = (int)local_40 * 2;
          while( true ) {
            iVar6 = local_9c;
            iVar4 = iVar4 + 2;
            iVar7 = (int)ppVVar19;
            if ((int)local_78 == iVar7) break;
            if ((local_58 == (ProgressBar *)0x0) || (local_58->nItemsNext <= iVar7)) {
              Extra_ProgressBarUpdate_int(local_58,iVar7,(char *)0x0);
            }
            local_98 = (FILE *)CONCAT44(local_98._4_4_,(int)local_38 + iVar7);
            local_88 = ppVVar19;
            uVar5 = Io_ReadAigerDecode((char **)&local_b0);
            uVar21 = Io_ReadAigerDecode((char **)&local_b0);
            uVar21 = iVar4 - (uVar21 + uVar5);
            pvVar17 = Vec_PtrEntry(pVVar13,uVar21 >> 1);
            pvVar18 = Vec_PtrEntry(pVVar13,iVar4 - uVar5 >> 1);
            pAVar11 = local_a8;
            if ((int)local_98 != pVVar13->nSize) {
              __assert_fail("Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadAiger.c"
                            ,0x199,"Abc_Ntk_t *Io_ReadAiger(char *, int)");
            }
            pAVar15 = Abc_AigAnd((Abc_Aig_t *)local_a8->pManFunc,
                                 (Abc_Obj_t *)((ulong)(uVar21 & 1) ^ (ulong)pvVar17),
                                 (Abc_Obj_t *)((ulong)pvVar18 ^ (ulong)(iVar4 - uVar5 & 1)));
            Vec_PtrPush(pVVar13,pAVar15);
            ppVVar19 = (Vec_Ptr_t **)(ulong)((int)local_88 + 1);
            pFVar10 = local_90;
          }
          Extra_ProgressBarStop(local_58);
          local_78 = local_b0;
          local_b0 = pFVar24;
          if (*(char *)((long)&pFVar10->_flags + 3) == ' ') {
            for (uVar5 = 0; (int)uVar5 < pAVar11->vBoxes->nSize; uVar5 = uVar5 + 1) {
              pAVar15 = Abc_NtkBox(pAVar11,uVar5);
              if ((*(uint *)&pAVar15->field_0x14 & 0xf) == 8) {
                pAVar15 = Abc_NtkBox(pAVar11,uVar5);
                local_98 = (FILE *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray];
                uVar21 = atoi((char *)pFVar24);
                do {
                  cVar20 = (char)pFVar24->_flags;
                  if (cVar20 == '\n') goto LAB_006cd86b;
                  pFVar24 = (FILE *)((long)&pFVar24->_flags + 1);
                } while (cVar20 != ' ');
                local_b0 = pFVar24;
                iVar4 = atoi((char *)pFVar24);
                if (iVar4 == 1) {
                  pAVar15 = Abc_NtkBox(pAVar11,uVar5);
                  if ((*(uint *)&pAVar15->field_0x14 & 0xf) != 8) {
                    __assert_fail("Abc_ObjIsLatch(pLatch)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                                  ,0x1a5,"void Abc_LatchSetInit1(Abc_Obj_t *)");
                  }
                  pAVar15->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
                }
                else if (iVar4 == 0) {
                  pAVar15 = Abc_NtkBox(pAVar11,uVar5);
                  Abc_LatchSetInit0(pAVar15);
                }
                else {
                  iVar7 = pAVar11->vPis->nSize + uVar5 + 1;
                  if (iVar7 < 0) {
                    __assert_fail("Var >= 0 && !(c >> 1)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                  ,0x12e,"int Abc_Var2Lit(int, int)");
                  }
                  if (iVar4 != iVar7 * 2) {
                    __assert_fail("Init == Abc_Var2Lit(1+Abc_NtkPiNum(pNtkNew)+i, 0)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadAiger.c"
                                  ,0x1b3,"Abc_Ntk_t *Io_ReadAiger(char *, int)");
                  }
                  pAVar15 = Abc_NtkBox(pAVar11,uVar5);
                  if ((*(uint *)&pAVar15->field_0x14 & 0xf) != 8) {
                    __assert_fail("Abc_ObjIsLatch(pLatch)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                                  ,0x1a6,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
                  }
                  pAVar15->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
                }
                for (; (cVar20 = (char)pFVar24->_flags, cVar20 != '\n' && (cVar20 != ' '));
                    pFVar24 = (FILE *)((long)&pFVar24->_flags + 1)) {
                }
LAB_006cd86b:
                if ((char)pFVar24->_flags != '\n') {
                  local_b0 = pFVar24;
                  fprintf(_stdout,"The initial value of latch number %d is not recongnized.\n",
                          (ulong)uVar5);
                  return (Abc_Ntk_t *)0x0;
                }
                pFVar24 = (FILE *)((long)&pFVar24->_flags + 1);
                local_b0 = pFVar24;
                pvVar17 = Vec_PtrEntry(local_70,uVar21 >> 1);
                Abc_ObjAddFanin((Abc_Obj_t *)local_98,
                                (Abc_Obj_t *)((ulong)(uVar21 & 1) ^ (ulong)pvVar17));
              }
            }
            for (iVar4 = 0; iVar4 < pAVar11->vPos->nSize; iVar4 = iVar4 + 1) {
              pAVar15 = Abc_NtkPo(pAVar11,iVar4);
              uVar5 = atoi((char *)pFVar24);
              do {
                piVar2 = &pFVar24->_flags;
                pFVar24 = (FILE *)((long)&pFVar24->_flags + 1);
              } while ((char)*piVar2 != '\n');
              pvVar17 = Vec_PtrEntry(local_70,uVar5 >> 1);
              Abc_ObjAddFanin(pAVar15,(Abc_Obj_t *)((ulong)(uVar5 & 1) ^ (ulong)pvVar17));
              pFVar10 = local_90;
            }
          }
          else {
            for (iVar4 = 0; iVar4 < pAVar11->vBoxes->nSize; iVar4 = iVar4 + 1) {
              pAVar15 = Abc_NtkBox(pAVar11,iVar4);
              if ((*(uint *)&pAVar15->field_0x14 & 0xf) == 8) {
                pAVar15 = Abc_NtkBox(pAVar11,iVar4);
                pAVar15 = (Abc_Obj_t *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray];
                uVar5 = Vec_IntEntry(local_48,iVar4);
                pvVar17 = Vec_PtrEntry(pVVar13,uVar5 >> 1);
                Abc_ObjAddFanin(pAVar15,(Abc_Obj_t *)((ulong)(uVar5 & 1) ^ (ulong)pvVar17));
              }
            }
            for (iVar4 = 0; __ptr = local_48, iVar4 < pAVar11->vPos->nSize; iVar4 = iVar4 + 1) {
              pAVar15 = Abc_NtkPo(pAVar11,iVar4);
              uVar5 = Vec_IntEntry(local_48,pAVar11->nObjCounts[8] + iVar4);
              pvVar17 = Vec_PtrEntry(pVVar13,uVar5 >> 1);
              Abc_ObjAddFanin(pAVar15,(Abc_Obj_t *)((ulong)(uVar5 & 1) ^ (ulong)pvVar17));
            }
            free(local_48->pArray);
            free(__ptr);
            pFVar10 = local_90;
          }
          local_98 = (FILE *)((long)&pFVar10->_flags + (long)(int)local_68);
          if ((local_78 < local_98) && ((char)local_78->_flags != 'c')) {
            local_68 = &pAVar11->vPos;
            local_88 = &pAVar11->vBoxes;
            pFVar9 = local_78;
            while (pNtk = local_a8, pFVar9 < local_98) {
              ppVVar19 = &pAVar11->vPis;
              switch((char)pFVar9->_flags) {
              case 'b':
              case 'f':
              case 'j':
              case 'o':
                ppVVar19 = local_68;
                break;
              case 'c':
                goto switchD_006cdb27_caseD_63;
              default:
                return (Abc_Ntk_t *)0x0;
              case 'i':
                break;
              case 'l':
                ppVVar19 = local_88;
              }
              pVVar13 = *ppVVar19;
              pFVar10 = (FILE *)((long)&pFVar9->_flags + 1);
              local_b0 = pFVar10;
              iVar4 = atoi((char *)pFVar10);
              do {
                piVar2 = &pFVar10->_flags;
                pFVar10 = (FILE *)((long)&pFVar10->_flags + 1);
              } while ((char)*piVar2 != ' ');
              local_b0 = pFVar10;
              if (pVVar13->nSize <= iVar4) {
                fwrite("The number of terminal is out of bound.\n",0x28,1,_stdout);
                return (Abc_Ntk_t *)0x0;
              }
              pAVar15 = (Abc_Obj_t *)Vec_PtrEntry(pVVar13,iVar4);
              local_b0 = pFVar10;
              if ((char)pFVar9->_flags == 'l') {
                pAVar15 = (Abc_Obj_t *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanouts).pArray];
              }
              do {
                pFVar24 = local_b0;
                local_b0 = (FILE *)((long)&pFVar24->_flags + 1);
              } while ((char)pFVar24->_flags != '\n');
              *(char *)&pFVar24->_flags = '\0';
              Abc_ObjAssignName(pAVar15,(char *)pFVar10,(char *)0x0);
              if ((char)pFVar9->_flags == 'l') {
                pAVar16 = (Abc_Obj_t *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray];
                pcVar22 = Abc_ObjName(pAVar15);
                Abc_ObjAssignName(pAVar16,pcVar22,"L");
                plVar1 = (long *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray];
                pAVar16 = *(Abc_Obj_t **)
                           (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
                pcVar22 = Abc_ObjName(pAVar15);
                Abc_ObjAssignName(pAVar16,pcVar22,"_in");
              }
              pcVar22 = Abc_ObjName(pAVar15);
              (pAVar15->field_6).pTemp = pcVar22;
              pFVar10 = local_90;
              pFVar9 = local_b0;
              iVar6 = local_9c;
            }
switchD_006cdb27_caseD_63:
            for (iVar4 = 0; pVVar13 = pAVar11->vPis, iVar4 < pVVar13->nSize; iVar4 = iVar4 + 1) {
              pAVar15 = (Abc_Obj_t *)Vec_PtrEntry(pVVar13,iVar4);
              if ((pAVar15->field_6).pTemp == (void *)0x0) {
                pcVar22 = Abc_ObjName(pAVar15);
                Abc_ObjAssignName(pAVar15,pcVar22,(char *)0x0);
              }
            }
            for (iVar4 = 0; pVVar13 = local_70, iVar4 < (*local_88)->nSize; iVar4 = iVar4 + 1) {
              pAVar15 = Abc_NtkBox(pNtk,iVar4);
              if ((*(uint *)&pAVar15->field_0x14 & 0xf) == 8) {
                pAVar15 = Abc_NtkBox(pNtk,iVar4);
                pAVar15 = (Abc_Obj_t *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanouts).pArray];
                if ((pAVar15->field_6).pTemp == (void *)0x0) {
                  pcVar22 = Abc_ObjName(pAVar15);
                  Abc_ObjAssignName(pAVar15,pcVar22,(char *)0x0);
                  pAVar16 = (Abc_Obj_t *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray];
                  pcVar22 = Abc_ObjName(pAVar15);
                  Abc_ObjAssignName(pAVar16,pcVar22,"L");
                  plVar1 = (long *)pAVar15->pNtk->vObjs->pArray[*(pAVar15->vFanins).pArray];
                  pAVar16 = *(Abc_Obj_t **)
                             (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8
                             );
                  pcVar22 = Abc_ObjName(pAVar15);
                  pFVar10 = local_90;
                  Abc_ObjAssignName(pAVar16,pcVar22,"_in");
                }
              }
              iVar6 = local_9c;
            }
            bVar25 = (byte)local_5c;
            for (iVar4 = 0; iVar4 < (*local_68)->nSize; iVar4 = iVar4 + 1) {
              pAVar15 = Abc_NtkPo(local_a8,iVar4);
              if ((pAVar15->field_6).pTemp == (void *)0x0) {
                pcVar22 = Abc_ObjName(pAVar15);
                Abc_ObjAssignName(pAVar15,pcVar22,(char *)0x0);
              }
            }
          }
          else {
            Abc_NtkShortNames(pAVar11);
            bVar25 = (byte)local_5c;
            pVVar13 = local_70;
          }
          pAVar11 = local_a8;
          local_b0 = local_78;
          pFVar9 = (FILE *)((long)&local_78->_flags + 1);
          if ((((pFVar9 < local_98) && ((char)local_78->_flags == 'c')) &&
              (local_b0 = pFVar9, (char)pFVar9->_flags == 'n')) &&
             (pFVar9 = (FILE *)((long)&local_78->_flags + 2), local_b0 = pFVar9,
             *(char *)((long)&local_78->_flags + 2) != '\0')) {
            if (local_a8->pName != (char *)0x0) {
              free(local_a8->pName);
              pAVar11->pName = (char *)0x0;
            }
            pcVar22 = Extra_UtilStrsav((char *)pFVar9);
            pAVar11->pName = pcVar22;
          }
          bVar27 = local_4c == 0;
          free(pFVar10);
          free(pVVar13->pArray);
          free(pVVar13);
          pAVar11 = local_a8;
          Abc_AigCleanup((Abc_Aig_t *)local_a8->pManFunc);
          if ((~bVar25 & bVar27) == 0) {
            Abc_NtkInvertConstraints(pAVar11);
          }
          if (iVar6 != 0) {
            iVar4 = Abc_NtkCheckRead(pAVar11);
            if (iVar4 == 0) {
              puts("Io_ReadAiger: The network check has failed.");
              Abc_NtkDelete(pAVar11);
              return (Abc_Ntk_t *)0x0;
            }
            return pAVar11;
          }
          return pAVar11;
        }
        pcVar22 = "Reading AIGER files with liveness properties is currently not supported.\n";
        sStack_c0 = 0x49;
        pFVar9 = local_90;
        goto LAB_006cd22c;
      }
      pcVar22 = "The number of objects does not match.\n";
      sStack_c0 = 0x26;
    }
    else {
      pcVar22 = "The parameter line is in a wrong format.\n";
      sStack_c0 = 0x29;
    }
    fwrite(pcVar22,sStack_c0,1,_stdout);
    pFVar9 = local_90;
  }
  else {
    pcVar22 = "Wrong input file format.\n";
    sStack_c0 = 0x19;
LAB_006cd22c:
    fwrite(pcVar22,sStack_c0,1,_stdout);
  }
  free(pFVar9);
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Io_ReadAiger( char * pFileName, int fCheck )
{
    ProgressBar * pProgress;
    FILE * pFile;
    Vec_Ptr_t * vNodes, * vTerms;
    Vec_Int_t * vLits = NULL;
    Abc_Obj_t * pObj, * pNode0, * pNode1;
    Abc_Ntk_t * pNtkNew;
    int nTotal, nInputs, nOutputs, nLatches, nAnds;
    int nBad = 0, nConstr = 0, nJust = 0, nFair = 0;
    int nFileSize = -1, iTerm, nDigits, i;
    char * pContents, * pDrivers = NULL, * pSymbols, * pCur, * pName, * pType;
    unsigned uLit0, uLit1, uLit;
    int RetValue;

    // read the file into the buffer
    if ( !strncmp(pFileName+strlen(pFileName)-4,".bz2",4) )
        pContents = Ioa_ReadLoadFileBz2Aig( pFileName, &nFileSize );
    else if ( !strncmp(pFileName+strlen(pFileName)-3,".gz",3) )
        pContents = Ioa_ReadLoadFileGzAig( pFileName, &nFileSize );
    else
    {
//        pContents = Ioa_ReadLoadFile( pFileName );
        nFileSize = Extra_FileSize( pFileName );
        pFile = fopen( pFileName, "rb" );
        pContents = ABC_ALLOC( char, nFileSize );
        RetValue = fread( pContents, nFileSize, 1, pFile );
        fclose( pFile );
    }


    // check if the input file format is correct
    if ( strncmp(pContents, "aig", 3) != 0 || (pContents[3] != ' ' && pContents[3] != '2') )
    {
        fprintf( stdout, "Wrong input file format.\n" );
        ABC_FREE( pContents );
        return NULL;
    }

    // read the parameters (M I L O A + B C J F)
    pCur = pContents;         while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of objects
    nTotal = atoi( pCur );    while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of inputs
    nInputs = atoi( pCur );   while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of latches
    nLatches = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of outputs
    nOutputs = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of nodes
    nAnds = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
    if ( *pCur == ' ' )
    {
//        assert( nOutputs == 0 );
        // read the number of properties
        pCur++;
        nBad = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nBad;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nConstr = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nConstr;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nJust = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nJust;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nFair = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nFair;
    }
    if ( *pCur != '\n' )
    {
        fprintf( stdout, "The parameter line is in a wrong format.\n" );
        ABC_FREE( pContents );
        return NULL;
    }
    pCur++;

    // check the parameters
    if ( nTotal != nInputs + nLatches + nAnds )
    {
        fprintf( stdout, "The number of objects does not match.\n" );
        ABC_FREE( pContents );
        return NULL;
    }
    if ( nJust || nFair )
    {
        fprintf( stdout, "Reading AIGER files with liveness properties is currently not supported.\n" );
        ABC_FREE( pContents );
        return NULL;
    }

    if ( nConstr )
    {
        if ( nConstr == 1 )
            fprintf( stdout, "Warning: The last output is interpreted as a constraint.\n" );
        else
            fprintf( stdout, "Warning: The last %d outputs are interpreted as constraints.\n", nConstr );
    }

    // allocate the empty AIG
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pName = Extra_FileNameGeneric( pFileName );
    pNtkNew->pName = Extra_UtilStrsav( pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pFileName );
    ABC_FREE( pName );
    pNtkNew->nConstrs = nConstr;

    // prepare the array of nodes
    vNodes = Vec_PtrAlloc( 1 + nInputs + nLatches + nAnds );
    Vec_PtrPush( vNodes, Abc_ObjNot( Abc_AigConst1(pNtkNew) ) );

    // create the PIs
    for ( i = 0; i < nInputs; i++ )
    {
        pObj = Abc_NtkCreatePi(pNtkNew);    
        Vec_PtrPush( vNodes, pObj );
    }
    // create the POs
    for ( i = 0; i < nOutputs; i++ )
    {
        pObj = Abc_NtkCreatePo(pNtkNew);   
    }
    // create the latches
    nDigits = Abc_Base10Log( nLatches );
    for ( i = 0; i < nLatches; i++ )
    {
        pObj = Abc_NtkCreateLatch(pNtkNew);
        Abc_LatchSetInit0( pObj );
        pNode0 = Abc_NtkCreateBi(pNtkNew);
        pNode1 = Abc_NtkCreateBo(pNtkNew);
        Abc_ObjAddFanin( pObj, pNode0 );
        Abc_ObjAddFanin( pNode1, pObj );
        Vec_PtrPush( vNodes, pNode1 );
        // assign names to latch and its input
//        Abc_ObjAssignName( pObj, Abc_ObjNameDummy("_L", i, nDigits), NULL );
//        printf( "Creating latch %s with input %d and output %d.\n", Abc_ObjName(pObj), pNode0->Id, pNode1->Id );
    } 
    

    if ( pContents[3] == ' ' ) // standard AIGER
    {
        // remember the beginning of latch/PO literals
        pDrivers = pCur;
        // scroll to the beginning of the binary data
        for ( i = 0; i < nLatches + nOutputs; )
            if ( *pCur++ == '\n' )
                i++;
    }
    else // modified AIGER
    { 
        vLits = Io_WriteDecodeLiterals( &pCur, nLatches + nOutputs );
    }

    // create the AND gates
    pProgress = Extra_ProgressBarStart( stdout, nAnds );
    for ( i = 0; i < nAnds; i++ )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        uLit = ((i + 1 + nInputs + nLatches) << 1);
        uLit1 = uLit  - Io_ReadAigerDecode( &pCur );
        uLit0 = uLit1 - Io_ReadAigerDecode( &pCur );
//        assert( uLit1 > uLit0 );
        pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), uLit0 & 1 );
        pNode1 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit1 >> 1), uLit1 & 1 );
        assert( Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches );
        Vec_PtrPush( vNodes, Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pNode0, pNode1) );
    }
    Extra_ProgressBarStop( pProgress );

    // remember the place where symbols begin
    pSymbols = pCur;

    // read the latch driver literals
    pCur = pDrivers;
    if ( pContents[3] == ' ' ) // standard AIGER
    {
        Abc_NtkForEachLatchInput( pNtkNew, pObj, i )
        {
            uLit0 = atoi( pCur );  while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
            if ( *pCur == ' ' ) // read initial value
            {
                int Init;
                pCur++;
                Init = atoi( pCur );
                if ( Init == 0 )
                    Abc_LatchSetInit0( Abc_NtkBox(pNtkNew, i) );
                else if ( Init == 1 )
                    Abc_LatchSetInit1( Abc_NtkBox(pNtkNew, i) );
                else 
                {
                    assert( Init == Abc_Var2Lit(1+Abc_NtkPiNum(pNtkNew)+i, 0) ); 
                    // unitialized value of the latch is the latch literal according to http://fmv.jku.at/hwmcc11/beyond1.pdf
                    Abc_LatchSetInitDc( Abc_NtkBox(pNtkNew, i) );
                }
                while ( *pCur != ' ' && *pCur != '\n' ) pCur++;
            }
            if ( *pCur != '\n' )
            {
                fprintf( stdout, "The initial value of latch number %d is not recongnized.\n", i );
                return NULL;
            }
            pCur++;

            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
        // read the PO driver literals
        Abc_NtkForEachPo( pNtkNew, pObj, i )
        {
            uLit0 = atoi( pCur );  while ( *pCur++ != '\n' );
            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
    }
    else
    {
        // read the latch driver literals
        Abc_NtkForEachLatchInput( pNtkNew, pObj, i )
        {
            uLit0 = Vec_IntEntry( vLits, i );
            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
        // read the PO driver literals
        Abc_NtkForEachPo( pNtkNew, pObj, i )
        {
            uLit0 = Vec_IntEntry( vLits, i+Abc_NtkLatchNum(pNtkNew) );
            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
        Vec_IntFree( vLits );
    }
 
    // read the names if present
    pCur = pSymbols;
    if ( pCur < pContents + nFileSize && *pCur != 'c' )
    {
        int Counter = 0;
        while ( pCur < pContents + nFileSize && *pCur != 'c' )
        {
            // get the terminal type
            pType = pCur;
            if ( *pCur == 'i' )
                vTerms = pNtkNew->vPis;
            else if ( *pCur == 'l' )
                vTerms = pNtkNew->vBoxes;
            else if ( *pCur == 'o' || *pCur == 'b' || *pCur == 'c' || *pCur == 'j' || *pCur == 'f' )
                vTerms = pNtkNew->vPos;
            else
            {
//                fprintf( stdout, "Wrong terminal type.\n" );
                return NULL;
            }
            // get the terminal number
            iTerm = atoi( ++pCur );  while ( *pCur++ != ' ' );
            // get the node
            if ( iTerm >= Vec_PtrSize(vTerms) )
            {
                fprintf( stdout, "The number of terminal is out of bound.\n" );
                return NULL;
            }
            pObj = (Abc_Obj_t *)Vec_PtrEntry( vTerms, iTerm );
            if ( *pType == 'l' )
                pObj = Abc_ObjFanout0(pObj);
            // assign the name
            pName = pCur;          while ( *pCur++ != '\n' );
            // assign this name 
            *(pCur-1) = 0;
            Abc_ObjAssignName( pObj, pName, NULL );
            if ( *pType == 'l' )
            {
                Abc_ObjAssignName( Abc_ObjFanin0(pObj), Abc_ObjName(pObj), "L" );
                Abc_ObjAssignName( Abc_ObjFanin0(Abc_ObjFanin0(pObj)), Abc_ObjName(pObj), "_in" );
            }
            // mark the node as named
            pObj->pCopy = (Abc_Obj_t *)Abc_ObjName(pObj);
        } 

        // assign the remaining names
        Abc_NtkForEachPi( pNtkNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Abc_ObjAssignName( pObj, Abc_ObjName(pObj), NULL );
            Counter++;
        }
        Abc_NtkForEachLatchOutput( pNtkNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Abc_ObjAssignName( pObj, Abc_ObjName(pObj), NULL );
            Abc_ObjAssignName( Abc_ObjFanin0(pObj), Abc_ObjName(pObj), "L" );
            Abc_ObjAssignName( Abc_ObjFanin0(Abc_ObjFanin0(pObj)), Abc_ObjName(pObj), "_in" );
            Counter++;
        }
        Abc_NtkForEachPo( pNtkNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Abc_ObjAssignName( pObj, Abc_ObjName(pObj), NULL );
            Counter++;
        }
//        if ( Counter )
//            printf( "Io_ReadAiger(): Added %d default names for nameless I/O/register objects.\n", Counter );
    }
    else
    {
//        printf( "Io_ReadAiger(): I/O/register names are not given. Generating short names.\n" );
        Abc_NtkShortNames( pNtkNew );
    }

    // read the name of the model if given
    pCur = pSymbols;
    if ( pCur + 1 < pContents + nFileSize && *pCur == 'c' )
    {
        pCur++;
        if ( *pCur == 'n' )
        {
            pCur++;
            // read model name
            if ( strlen(pCur) > 0 )
            {
                ABC_FREE( pNtkNew->pName );
                pNtkNew->pName = Extra_UtilStrsav( pCur );
            }
        }
    }

    // skipping the comments
    ABC_FREE( pContents );
    Vec_PtrFree( vNodes );

    // remove the extra nodes
    Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );

    // update polarity of the additional outputs
    if ( nBad || nConstr || nJust || nFair )
        Abc_NtkInvertConstraints( pNtkNew );

    // check the result
    if ( fCheck && !Abc_NtkCheckRead( pNtkNew ) )
    {
        printf( "Io_ReadAiger: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}